

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O0

int cvcMain(int argc,char **argv)

{
  int iVar1;
  err_t code_00;
  char *pcVar2;
  long in_RSI;
  int in_EDI;
  err_t code;
  char **in_stack_00000018;
  int in_stack_00000020;
  char **in_stack_00000028;
  int in_stack_00000030;
  char **in_stack_00000038;
  int in_stack_00000040;
  char **in_stack_00000168;
  int in_stack_00000170;
  char **in_stack_00000178;
  int in_stack_00000180;
  char **in_stack_000001a8;
  int in_stack_000001b0;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_EDI < 2) {
    local_4 = cvcUsage();
  }
  else {
    pcVar2 = (char *)(in_RSI + 8);
    iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar1 == 0) {
      code_00 = cvcRoot(in_stack_00000170,in_stack_00000168);
    }
    else {
      iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (iVar1 == 0) {
        code_00 = cvcReq(in_stack_00000170,in_stack_00000168);
      }
      else {
        iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
        ;
        if (iVar1 == 0) {
          code_00 = cvcIss(in_stack_000001b0,in_stack_000001a8);
        }
        else {
          iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
                                                ));
          if (iVar1 == 0) {
            code_00 = cvcShorten(in_stack_00000180,in_stack_00000178);
          }
          else {
            iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,
                                                   in_stack_ffffffffffffffe8));
            if (iVar1 == 0) {
              code_00 = cvcVal(in_stack_00000040,in_stack_00000038);
            }
            else {
              iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,
                                                     in_stack_ffffffffffffffe8));
              if (iVar1 == 0) {
                code_00 = cvcMatch(in_stack_00000030,in_stack_00000028);
              }
              else {
                iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,
                                                       in_stack_ffffffffffffffe8));
                if (iVar1 == 0) {
                  code_00 = cvcExtr(argc,argv);
                }
                else {
                  iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,
                                                         in_stack_ffffffffffffffe8));
                  if (iVar1 == 0) {
                    code_00 = cvcPrint(in_stack_00000020,in_stack_00000018);
                  }
                  else {
                    code_00 = 0x259;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (((code_00 != 0) ||
        (iVar1 = strCmp(pcVar2,(char *)(ulong)in_stack_ffffffffffffffe8), iVar1 == 0)) ||
       (iVar1 = strCmp(pcVar2,(char *)CONCAT44(code_00,in_stack_ffffffffffffffe8)), iVar1 == 0)) {
      pcVar2 = errMsg(code_00);
      printf("bee2cmd/%s: %s\n","cvc",pcVar2);
    }
    local_4 = 0;
    if (code_00 != 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int cvcMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return cvcUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "root"))
		code = cvcRoot(argc - 1, argv + 1);
	else if (strEq(argv[0], "req"))
		code = cvcReq(argc - 1, argv + 1);
	else if (strEq(argv[0], "iss"))
		code = cvcIss(argc - 1, argv + 1);
	else if (strEq(argv[0], "shorten"))
		code = cvcShorten(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = cvcVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "match"))
		code = cvcMatch(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = cvcExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = cvcPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val") || strEq(argv[0], "match"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}